

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O2

void __thiscall
ConfidentialTransaction_GetIssuanceBlindingKeyTest_Test::TestBody
          (ConfidentialTransaction_GetIssuanceBlindingKeyTest_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  AssertHelper local_90;
  string local_88;
  Privkey key;
  Txid txid;
  Privkey masterkey;
  
  std::__cxx11::string::string
            ((string *)&txid,"a0cd219833629db30c5210716c7b2e22fb8dd10aa231692f1f53acd8e662de01",
             (allocator *)&key);
  cfd::core::Privkey::Privkey(&masterkey,(string *)&txid,kMainnet,true);
  std::__cxx11::string::~string((string *)&txid);
  std::__cxx11::string::string
            ((string *)&key,"21fe3fc8e38256ec747fa8d8ea96319fd00cbcf318c2586b9b8e9e27a5afe9aa",
             (allocator *)&local_88);
  cfd::core::Txid::Txid(&txid,(string *)&key);
  std::__cxx11::string::~string((string *)&key);
  cfd::core::Privkey::Privkey(&key);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::GetIssuanceBlindingKey
                ((Privkey *)&local_88,&masterkey,&txid,0);
      cfd::core::Privkey::operator=(&key,(Privkey *)&local_88);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88);
    }
  }
  else {
    testing::Message::Message((Message *)&local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x748,
               "Expected: (key = ConfidentialTransaction::GetIssuanceBlindingKey( masterkey, txid, vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_88);
  }
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_88,&key);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"key.GetHex().c_str()",
             "\"24c10c3b128f220e3b4253cec39ea3b75d2f6000033508c8deeadc1b6eefc4a1\"",
             local_88._M_dataplus._M_p,
             "24c10c3b128f220e3b4253cec39ea3b75d2f6000033508c8deeadc1b6eefc4a1");
  std::__cxx11::string::~string((string *)&local_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_88);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x74c,message);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_88);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
  cfd::core::Txid::~Txid(&txid);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&masterkey);
  return;
}

Assistant:

TEST(ConfidentialTransaction, GetIssuanceBlindingKeyTest) {
  Privkey masterkey(
      "a0cd219833629db30c5210716c7b2e22fb8dd10aa231692f1f53acd8e662de01");
  Txid txid(
      "21fe3fc8e38256ec747fa8d8ea96319fd00cbcf318c2586b9b8e9e27a5afe9aa");
  uint32_t vout = 0;
  Privkey key;
  EXPECT_NO_THROW(
    (key = ConfidentialTransaction::GetIssuanceBlindingKey(
        masterkey, txid, vout)));

  EXPECT_STREQ(
      key.GetHex().c_str(),
      "24c10c3b128f220e3b4253cec39ea3b75d2f6000033508c8deeadc1b6eefc4a1");
}